

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# id3.c
# Opt level: O3

int id3_write_tag(file_t *outfile,char *album_title,char *artist,char *title,uint track_number,
                 char *comment)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  uchar *buf;
  char tracknumber [256];
  uchar id3 [8192];
  char local_2138 [256];
  uchar local_2038 [10];
  uchar local_202e [8190];
  
  buf = local_202e;
  uVar4 = 0x1ff6;
  uVar1 = 0;
  if ((album_title != (char *)0x0) && (uVar1 = 0, *album_title != '\0')) {
    uVar1 = id3_fill_tframe(buf,0x1ff6,"TAL",'\0',album_title);
    if (uVar1 == 0) {
      return 0;
    }
    uVar4 = 0x1ff6 - uVar1;
    buf = buf + uVar1;
  }
  if ((artist != (char *)0x0) && (*artist != '\0')) {
    uVar2 = id3_fill_tframe(buf,uVar4,"TP1",'\0',artist);
    if (uVar2 == 0) {
      return 0;
    }
    uVar4 = uVar4 - uVar2;
    buf = buf + uVar2;
    uVar1 = uVar1 + uVar2;
  }
  if ((title != (char *)0x0) && (*title != '\0')) {
    uVar2 = id3_fill_tframe(buf,uVar4,"TT2",'\0',title);
    if (uVar2 == 0) {
      return 0;
    }
    uVar4 = uVar4 - uVar2;
    buf = buf + uVar2;
    uVar1 = uVar1 + uVar2;
  }
  if (track_number != 0) {
    snprintf(local_2138,0x100,"%d");
    uVar2 = id3_fill_tframe(buf,uVar4,"TRK",'\0',local_2138);
    if (uVar2 == 0) {
      return 0;
    }
    uVar4 = uVar4 - uVar2;
    buf = buf + uVar2;
    uVar1 = uVar1 + uVar2;
  }
  if ((comment != (char *)0x0) && (*comment != '\0')) {
    uVar4 = id3_fill_comment(buf,uVar4,'\0',(char *)0x0,comment,"eng");
    if (uVar4 == 0) {
      return 0;
    }
    uVar1 = uVar1 + uVar4;
  }
  iVar3 = id3_fill_header(local_2038,0x2000,(ulong)uVar1);
  if (iVar3 == 0) {
    uVar1 = 0;
  }
  else {
    uVar4 = file_write(outfile,local_2038,(ulong)(uVar1 + 10));
    uVar1 = (uint)(uVar4 == uVar1 + 10);
  }
  return uVar1;
}

Assistant:

int id3_write_tag(file_t *outfile,
                  char *album_title,
                  char *artist,
                  char *title,
                  unsigned int track_number,
                  char *comment) {
  /* write id3 tags */
  unsigned char id3[ID3_TAG_SIZE];
  unsigned char *ptr = id3 + ID3_HEADER_SIZE;
  unsigned int size = 0, bytes_left = sizeof(id3) - ID3_HEADER_SIZE;
  unsigned int len;

  if (album_title && strlen(album_title) > 0) {
    len = id3_fill_tframe(ptr, bytes_left, "TAL", 0, album_title);
    if (len == 0)
      return 0;
    bytes_left -= len; ptr += len; size += len;
  }

  if (artist && strlen(artist) > 0) {
    len = id3_fill_tframe(ptr, bytes_left, "TP1", 0, artist);
    if (len == 0)
      return 0;
    bytes_left -= len; ptr += len; size += len;
  }
    
  if (title && strlen(title) > 0) {
    len = id3_fill_tframe(ptr, bytes_left, "TT2", 0, title);
    if (len == 0)
      return 0;
    bytes_left -= len; ptr += len; size += len;
  }

  if (track_number > 0) {
    char tracknumber[256];
    snprintf(tracknumber, 256, "%d", track_number);
    len = id3_fill_tframe(ptr, bytes_left, "TRK", 0, tracknumber);
    if (len == 0)
      return 0;
    bytes_left -= len; ptr += len; size += len;
  }

  if (comment && strlen(comment) > 0) {
    len = id3_fill_comment(ptr, bytes_left, 0,
                           NULL,
                           comment,
                           "eng");
    if (len == 0)
      return 0;
    bytes_left -= len; ptr += len; size += len;
  }

  if (id3_fill_header(id3, sizeof(id3), size) == 0)
    return 0;

  len = file_write(outfile, id3, size + ID3_HEADER_SIZE);
  if (len != size + ID3_HEADER_SIZE)
    return 0;

  return 1;
}